

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_OnUnhandledDispatch_Test::TestBody(NLReaderTest_OnUnhandledDispatch_Test *this)

{
  StringRef value;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *pNVar1;
  LogicalExpr LVar2;
  LogicalExpr LVar3;
  MockSpec<void_(const_char_*)> *call;
  MockSpec<void_(const_char_*)> *__a;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_49;
  MockNLHandler handler_49;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_48;
  MockNLHandler handler_48;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_47;
  MockNLHandler handler_47;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_46;
  MockNLHandler handler_46;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_45;
  MockNLHandler handler_45;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_44;
  MockNLHandler handler_44;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_43;
  MockNLHandler handler_43;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_42;
  MockNLHandler handler_42;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_41;
  MockNLHandler handler_41;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_40;
  MockNLHandler handler_40;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_39;
  MockNLHandler handler_39;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_38;
  MockNLHandler handler_38;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_37;
  MockNLHandler handler_37;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_36;
  MockNLHandler handler_36;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_35;
  MockNLHandler handler_35;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_34;
  MockNLHandler handler_34;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_33;
  MockNLHandler handler_33;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_32;
  MockNLHandler handler_32;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_31;
  MockNLHandler handler_31;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_30;
  MockNLHandler handler_30;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_29;
  MockNLHandler handler_29;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_28;
  MockNLHandler handler_28;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_27;
  MockNLHandler handler_27;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_26;
  MockNLHandler handler_26;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_25;
  MockNLHandler handler_25;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_24;
  MockNLHandler handler_24;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_23;
  MockNLHandler handler_23;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_22;
  MockNLHandler handler_22;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_21;
  MockNLHandler handler_21;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_20;
  MockNLHandler handler_20;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_19;
  MockNLHandler handler_19;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_18;
  MockNLHandler handler_18;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_17;
  MockNLHandler handler_17;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_16;
  MockNLHandler handler_16;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_15;
  MockNLHandler handler_15;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_14;
  MockNLHandler handler_14;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_13;
  MockNLHandler handler_13;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_12;
  MockNLHandler handler_12;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_11;
  MockNLHandler handler_11;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_10;
  MockNLHandler handler_10;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_9;
  MockNLHandler handler_9;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_8;
  MockNLHandler handler_8;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_7;
  MockNLHandler handler_7;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_6;
  MockNLHandler handler_6;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_5;
  MockNLHandler handler_5;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_4;
  MockNLHandler handler_4;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_3;
  MockNLHandler handler_3;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_2;
  MockNLHandler handler_2;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base_1;
  MockNLHandler handler_1;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *base;
  MockNLHandler handler;
  int in_stack_ffffffffffff3df8;
  Kind in_stack_ffffffffffff3dfc;
  MockNLHandler *in_stack_ffffffffffff3e00;
  MockNLHandler *pMVar4;
  NLHeader *in_stack_ffffffffffff3e08;
  LogicalExpr in_stack_ffffffffffff3e10;
  ComplInfo in_stack_ffffffffffff3e14;
  MockNLHandler *this_00;
  LogicalExpr in_stack_ffffffffffff3e18;
  LogicalExpr in_stack_ffffffffffff3e1c;
  allocator<char> *paVar5;
  LogicalExpr in_stack_ffffffffffff3e20;
  undefined4 in_stack_ffffffffffff3e24;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffff3e28;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator<char> *in_stack_ffffffffffff3e30;
  char *in_stack_ffffffffffff3e38;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__s;
  MockNLHandler *in_stack_ffffffffffff3e40;
  undefined4 in_stack_ffffffffffff3e48;
  undefined4 in_stack_ffffffffffff3e4c;
  char *in_stack_ffffffffffff3ef0;
  char *in_stack_ffffffffffff3ef8;
  char *obj;
  undefined8 in_stack_ffffffffffff3f00;
  int iVar6;
  undefined4 in_stack_ffffffffffff3f08;
  undefined4 in_stack_ffffffffffff3f0c;
  MockSpec<void_(const_char_*)> *in_stack_ffffffffffff3f10;
  MockSpec<void_(const_char_*)> *this_02;
  BasicTestExpr<0> local_bbe0;
  BasicTestExpr<0> local_bbdc;
  BasicTestExpr<0> local_bbd8;
  allocator<char> local_bbd1;
  string local_bbd0 [96];
  MockNLHandler *local_bb70;
  MockNLHandler local_bb68;
  IDType local_b81c;
  undefined1 local_b801 [97];
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b7a0;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b798 [21];
  IDType local_b450;
  allocator<char> local_b449;
  string local_b448 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_b3e8;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_b3e0 [105];
  allocator<char> local_b091;
  string local_b090 [96];
  undefined1 *local_b030;
  undefined1 local_b028 [840];
  IDType local_ace0;
  allocator<char> local_acd9;
  string local_acd8 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_ac78;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_ac70 [105];
  allocator<char> local_a921;
  string local_a920 [96];
  undefined1 *local_a8c0;
  undefined1 local_a8b8 [844];
  IDType local_a56c;
  BasicTestExpr<0> local_a568;
  BasicTestExpr<0> local_a564;
  BasicTestExpr<0> local_a560;
  allocator<char> local_a559;
  string local_a558 [96];
  undefined1 *local_a4f8;
  undefined1 local_a4f0 [840];
  IDType local_a1a8;
  BasicTestExpr<0> local_a1a4;
  BasicTestExpr<0> local_a1a0;
  allocator<char> local_a199;
  string local_a198 [96];
  char *local_a138;
  char local_a130 [840];
  IDType local_9de8;
  BasicTestExpr<0> local_9de4;
  BasicTestExpr<0> local_9de0;
  allocator<char> local_9dd9;
  string local_9dd8 [96];
  MockSpec<void_(const_char_*)> *local_9d78;
  MockSpec<void_(const_char_*)> local_9d70 [26];
  IDType local_9a28;
  BasicTestExpr<0> local_9a24;
  BasicTestExpr<0> local_9a20;
  allocator<char> local_9a19;
  string local_9a18 [96];
  undefined1 *local_99b8;
  undefined1 local_99b0 [844];
  IDType local_9664;
  BasicTestExpr<0> local_9660;
  allocator<char> local_9659;
  string local_9658 [96];
  undefined1 *local_95f8;
  undefined1 local_95f0 [840];
  IDType local_92a8;
  allocator<char> local_92a1;
  string local_92a0 [96];
  undefined1 *local_9240;
  undefined1 local_9238 [840];
  IDType local_8ef0;
  allocator<char> local_8ee9;
  string local_8ee8 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_8e88;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_8e80 [106];
  BasicTestExpr<0> local_8b30;
  allocator<char> local_8b29;
  string local_8b28 [96];
  undefined1 *local_8ac8;
  undefined1 local_8ac0 [840];
  IDType local_8778;
  allocator<char> local_8771;
  string local_8770 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_8710;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_8708 [106];
  BasicTestExpr<0> local_83b8;
  allocator<char> local_83b1;
  string local_83b0 [96];
  undefined1 *local_8350;
  undefined1 local_8348 [840];
  IDType local_8000;
  allocator<char> local_7ff9;
  string local_7ff8 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_7f98;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_7f90 [105];
  allocator<char> local_7c41;
  string local_7c40 [96];
  undefined1 *local_7be0;
  undefined1 local_7bd8 [840];
  IDType local_7890;
  allocator<char> local_7889;
  string local_7888 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_7828;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_7820 [105];
  allocator<char> local_74d1;
  string local_74d0 [96];
  undefined1 *local_7470;
  undefined1 local_7468 [840];
  IDType local_7120;
  allocator<char> local_7119;
  string local_7118 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_70b8;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_70b0 [105];
  allocator<char> local_6d61;
  string local_6d60 [96];
  undefined1 *local_6d00;
  undefined1 local_6cf8 [840];
  IDType local_69b0;
  allocator<char> local_69a9;
  string local_69a8 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_6948;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_6940 [105];
  allocator<char> local_65f1;
  string local_65f0 [96];
  undefined1 *local_6590;
  undefined1 local_6588 [844];
  IDType local_623c;
  BasicTestExpr<0> local_6238;
  allocator<char> local_6231;
  string local_6230 [96];
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *local_61d0;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> local_61c8 [105];
  allocator<char> local_5e79;
  string local_5e78 [96];
  undefined1 *local_5e18;
  undefined1 local_5e10 [844];
  IDType local_5ac4;
  BasicTestExpr<0> local_5ac0;
  BasicTestExpr<0> local_5abc;
  BasicTestExpr<0> local_5ab8;
  allocator<char> local_5ab1;
  string local_5ab0 [96];
  undefined1 *local_5a50;
  undefined1 local_5a48 [840];
  IDType local_5700;
  BasicTestExpr<0> local_56fc;
  BasicTestExpr<0> local_56f8;
  allocator<char> local_56f1;
  string local_56f0 [96];
  undefined1 *local_5690;
  undefined1 local_5688 [844];
  IDType local_533c;
  BasicTestExpr<0> local_5338;
  allocator<char> local_5331;
  string local_5330 [96];
  undefined1 *local_52d0;
  undefined1 local_52c8 [840];
  IDType local_4f80;
  allocator<char> local_4f79;
  string local_4f78 [96];
  undefined1 *local_4f18;
  undefined1 local_4f10 [840];
  IDType local_4bc8;
  allocator<char> local_4bc1;
  string local_4bc0 [96];
  undefined1 *local_4b60;
  undefined1 local_4b58 [840];
  IDType local_4810;
  allocator<char> local_4809;
  string local_4808 [96];
  undefined1 *local_47a8;
  undefined1 local_47a0 [871];
  allocator<char> local_4439;
  string local_4438 [96];
  undefined1 *local_43d8;
  undefined1 local_43d0 [871];
  allocator<char> local_4069;
  string local_4068 [96];
  undefined1 *local_4008;
  undefined1 local_4000 [863];
  allocator<char> local_3ca1;
  string local_3ca0 [96];
  undefined1 *local_3c40;
  undefined1 local_3c38 [847];
  allocator<char> local_38e9;
  string local_38e8 [96];
  undefined1 *local_3888;
  undefined1 local_3880 [847];
  allocator<char> local_3531;
  string local_3530 [96];
  undefined1 *local_34d0;
  undefined1 local_34c8 [847];
  allocator<char> local_3179;
  string local_3178 [96];
  undefined1 *local_3118;
  undefined1 local_3110 [847];
  allocator<char> local_2dc1;
  string local_2dc0 [96];
  undefined1 *local_2d60;
  undefined1 local_2d58 [847];
  allocator<char> local_2a09;
  string local_2a08 [96];
  undefined1 *local_29a8;
  undefined1 local_29a0 [847];
  allocator<char> local_2651;
  string local_2650 [96];
  undefined1 *local_25f0;
  undefined1 local_25e8 [847];
  allocator<char> local_2299;
  string local_2298 [96];
  undefined1 *local_2238;
  undefined1 local_2230 [847];
  allocator<char> local_1ee1;
  string local_1ee0 [96];
  undefined1 *local_1e80;
  undefined1 local_1e78 [847];
  allocator<char> local_1b29;
  string local_1b28 [96];
  undefined1 *local_1ac8;
  undefined1 local_1ac0 [840];
  BasicTestExpr<0> local_1778;
  allocator<char> local_1771;
  string local_1770 [96];
  undefined1 *local_1710;
  undefined1 local_1708 [847];
  allocator<char> local_13b9;
  string local_13b8 [96];
  undefined1 *local_1358;
  undefined1 local_1350 [840];
  BasicTestExpr<0> local_1008;
  allocator<char> local_1001;
  string local_1000 [96];
  undefined1 *local_fa0;
  undefined1 local_f98 [840];
  BasicTestExpr<0> local_c50;
  allocator<char> local_c49;
  string local_c48 [96];
  undefined1 *local_be8;
  undefined1 local_be0 [840];
  BasicTestExpr<0> local_898;
  allocator<char> local_891;
  string local_890 [96];
  undefined1 *local_830;
  undefined1 local_828 [840];
  undefined1 local_4e0 [295];
  allocator<char> local_3b9;
  string local_3b8 [96];
  undefined1 *local_358;
  undefined1 local_350 [848];
  
  iVar6 = (int)((ulong)in_stack_ffffffffffff3f00 >> 0x20);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_358 = local_350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x17298a);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x172997);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  memset(local_4e0,0,0x110);
  mp::NLHeader::NLHeader((NLHeader *)in_stack_ffffffffffff3e00);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnHeader
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             in_stack_ffffffffffff3e08);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_830 = local_828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x172aeb);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x172af8);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator(&local_891);
  BasicTestExpr<0>::BasicTestExpr(&local_898,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnObj
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),(Type)in_stack_ffffffffffff3e00,
             (NumericExpr)in_stack_ffffffffffff3e14.flags_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_be8 = local_be0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x172c38);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x172c45);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator(&local_c49);
  BasicTestExpr<0>::BasicTestExpr(&local_c50,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnAlgebraicCon
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),
             (NumericExpr)in_stack_ffffffffffff3e14.flags_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_fa0 = local_f98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x172d80);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x172d8d);
  std::__cxx11::string::~string(local_1000);
  std::allocator<char>::~allocator(&local_1001);
  BasicTestExpr<0>::BasicTestExpr(&local_1008,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnLogicalCon
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),
             (LogicalExpr)in_stack_ffffffffffff3e14.flags_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_1358 = local_1350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x172ec8);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x172ed5);
  std::__cxx11::string::~string(local_13b8);
  std::allocator<char>::~allocator(&local_13b9);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginCommonExpr
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_1710 = local_1708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x172fea);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x172ff7);
  std::__cxx11::string::~string(local_1770);
  std::allocator<char>::~allocator(&local_1771);
  BasicTestExpr<0>::BasicTestExpr(&local_1778,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCommonExpr
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),
             (NumericExpr)in_stack_ffffffffffff3e14.flags_,(int)in_stack_ffffffffffff3e00);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_1ac8 = local_1ac0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173134);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173141);
  std::__cxx11::string::~string(local_1b28);
  std::allocator<char>::~allocator(&local_1b29);
  mp::ComplInfo::ComplInfo
            ((ComplInfo *)CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             (int)((ulong)in_stack_ffffffffffff3e08 >> 0x20));
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnComplementarity
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),(int)in_stack_ffffffffffff3e00,
             in_stack_ffffffffffff3e14);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_1e80 = local_1e78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x17327e);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17328b);
  std::__cxx11::string::~string(local_1ee0);
  std::allocator<char>::~allocator(&local_1ee1);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnLinearObjExpr
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_2238 = local_2230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1733a0);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1733ad);
  std::__cxx11::string::~string(local_2298);
  std::allocator<char>::~allocator(&local_2299);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnLinearConExpr
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_25f0 = local_25e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1734c2);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1734cf);
  std::__cxx11::string::~string(local_2650);
  std::allocator<char>::~allocator(&local_2651);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnLinearCommonExpr
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_29a8 = local_29a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1735e4);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1735f1);
  std::__cxx11::string::~string(local_2a08);
  std::allocator<char>::~allocator(&local_2a09);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnVarBounds
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             (int)((ulong)in_stack_ffffffffffff3e08 >> 0x20),(double)in_stack_ffffffffffff3e00,
             (double)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_2d60 = local_2d58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x17370a);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173717);
  std::__cxx11::string::~string(local_2dc0);
  std::allocator<char>::~allocator(&local_2dc1);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnConBounds
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             (int)((ulong)in_stack_ffffffffffff3e08 >> 0x20),(double)in_stack_ffffffffffff3e00,
             (double)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_3118 = local_3110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173830);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17383d);
  std::__cxx11::string::~string(local_3178);
  std::allocator<char>::~allocator(&local_3179);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnInitialValue
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             (int)((ulong)in_stack_ffffffffffff3e08 >> 0x20),(double)in_stack_ffffffffffff3e00);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_34d0 = local_34c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173953);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173960);
  std::__cxx11::string::~string(local_3530);
  std::allocator<char>::~allocator(&local_3531);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnInitialDualValue
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             (int)((ulong)in_stack_ffffffffffff3e08 >> 0x20),(double)in_stack_ffffffffffff3e00);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_3888 = local_3880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173a76);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173a83);
  std::__cxx11::string::~string(local_38e8);
  std::allocator<char>::~allocator(&local_38e9);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnColumnSizes
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)0x173aaa);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_3c40 = local_3c38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173b94);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173ba1);
  std::__cxx11::string::~string(local_3ca0);
  std::allocator<char>::~allocator(&local_3ca1);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffff3e00,
             (char *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  name.data_._4_4_ = in_stack_ffffffffffff3e1c.id_;
  name.data_._0_4_ = in_stack_ffffffffffff3e18.id_;
  name.size_._0_4_ = in_stack_ffffffffffff3e20.id_;
  name.size_._4_4_ = in_stack_ffffffffffff3e24;
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnFunction
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
             (int)((ulong)in_stack_ffffffffffff3e08 >> 0x20),name,(int)in_stack_ffffffffffff3e08,
             (Type)((ulong)in_stack_ffffffffffff3e00 >> 0x20));
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_4008 = local_4000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173cf1);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173cfe);
  std::__cxx11::string::~string(local_4068);
  std::allocator<char>::~allocator(&local_4069);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffff3e00,
             (char *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  name_00.data_._4_4_ = in_stack_ffffffffffff3e1c.id_;
  name_00.data_._0_4_ = in_stack_ffffffffffff3e18.id_;
  name_00.size_._0_4_ = in_stack_ffffffffffff3e20.id_;
  name_00.size_._4_4_ = in_stack_ffffffffffff3e24;
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnIntSuffix
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),name_00,
             (Kind)((ulong)in_stack_ffffffffffff3e08 >> 0x20),(int)in_stack_ffffffffffff3e08);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_43d8 = local_43d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173e4d);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173e5a);
  std::__cxx11::string::~string(local_4438);
  std::allocator<char>::~allocator(&local_4439);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffff3e00,
             (char *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  name_01.data_._4_4_ = in_stack_ffffffffffff3e1c.id_;
  name_01.data_._0_4_ = in_stack_ffffffffffff3e18.id_;
  name_01.size_._0_4_ = in_stack_ffffffffffff3e20.id_;
  name_01.size_._4_4_ = in_stack_ffffffffffff3e24;
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnDblSuffix
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
             CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),name_01,
             (Kind)((ulong)in_stack_ffffffffffff3e08 >> 0x20),(int)in_stack_ffffffffffff3e08);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_47a8 = local_47a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x173fa9);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x173fb6);
  std::__cxx11::string::~string(local_4808);
  std::allocator<char>::~allocator(&local_4809);
  local_4810 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnNumber
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,(double)in_stack_ffffffffffff3e00);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_4b60 = local_4b58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1740df);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1740ec);
  std::__cxx11::string::~string(local_4bc0);
  std::allocator<char>::~allocator(&local_4bc1);
  local_4bc8 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnVariableRef
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,
                                  (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20));
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_4f18 = local_4f10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174214);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174221);
  std::__cxx11::string::~string(local_4f78);
  std::allocator<char>::~allocator(&local_4f79);
  local_4f80 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnCommonExprRef
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,
                                  (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20));
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_52d0 = local_52c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174349);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174356);
  std::__cxx11::string::~string(local_5330);
  std::allocator<char>::~allocator(&local_5331);
  BasicTestExpr<0>::BasicTestExpr(&local_5338,NULL_ID);
  local_533c = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnUnary
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,
                                  (Kind)((ulong)in_stack_ffffffffffff3e00 >> 0x20),
                                  in_stack_ffffffffffff3e10.id_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_5690 = local_5688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1744a9);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1744b6);
  std::__cxx11::string::~string(local_56f0);
  std::allocator<char>::~allocator(&local_56f1);
  BasicTestExpr<0>::BasicTestExpr(&local_56f8,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_56fc,NULL_ID);
  local_5700 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnBinary
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  CONCAT44(in_stack_ffffffffffff3e14.flags_,
                                           in_stack_ffffffffffff3e10.id_),
                                  (Kind)((ulong)in_stack_ffffffffffff3e08 >> 0x20),
                                  in_stack_ffffffffffff3e20.id_,in_stack_ffffffffffff3e1c.id_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_5a50 = local_5a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174621);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17462e);
  std::__cxx11::string::~string(local_5ab0);
  std::allocator<char>::~allocator(&local_5ab1);
  BasicTestExpr<0>::BasicTestExpr(&local_5ab8,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_5abc,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_5ac0,NULL_ID);
  local_5ac4 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnIf
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  CONCAT44(in_stack_ffffffffffff3e14.flags_,
                                           in_stack_ffffffffffff3e10.id_),in_stack_ffffffffffff3e20,
                                  in_stack_ffffffffffff3e1c.id_,in_stack_ffffffffffff3e18.id_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_5e18 = local_5e10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1747ac);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1747b9);
  std::__cxx11::string::~string(local_5e78);
  std::allocator<char>::~allocator(&local_5e79);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginPLTerm
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_61d0 = local_61c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1748cc);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1748d9);
  std::__cxx11::string::~string(local_6230);
  std::allocator<char>::~allocator(&local_6231);
  pNVar1 = local_61d0;
  BasicTestExpr<0>::BasicTestExpr(&local_6238,NULL_ID);
  local_623c = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndPLTerm
                                 (pNVar1,local_6238.id_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_6590 = local_6588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174a27);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174a34);
  std::__cxx11::string::~string(local_65f0);
  std::allocator<char>::~allocator(&local_65f1);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginCall
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_6948 = local_6940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174b49);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174b56);
  std::__cxx11::string::~string(local_69a8);
  std::allocator<char>::~allocator(&local_69a9);
  local_69b0 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCall(local_6948);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_6d00 = local_6cf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174c7c);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174c89);
  std::__cxx11::string::~string(local_6d60);
  std::allocator<char>::~allocator(&local_6d61);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginVarArg
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_70b8 = local_70b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174da1);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174dae);
  std::__cxx11::string::~string(local_7118);
  std::allocator<char>::~allocator(&local_7119);
  local_7120 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndVarArg(local_70b8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_7470 = local_7468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174ed4);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x174ee1);
  std::__cxx11::string::~string(local_74d0);
  std::allocator<char>::~allocator(&local_74d1);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginSum
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_7828 = local_7820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x174ff4);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175001);
  std::__cxx11::string::~string(local_7888);
  std::allocator<char>::~allocator(&local_7889);
  local_7890 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndSum(local_7828);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_7be0 = local_7bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175127);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175134);
  std::__cxx11::string::~string(local_7c40);
  std::allocator<char>::~allocator(&local_7c41);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginCount
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_7f98 = local_7f90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175247);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175254);
  std::__cxx11::string::~string(local_7ff8);
  std::allocator<char>::~allocator(&local_7ff9);
  local_8000 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCount(local_7f98);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_8350 = local_8348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x17537a);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175387);
  std::__cxx11::string::~string(local_83b0);
  std::allocator<char>::~allocator(&local_83b1);
  BasicTestExpr<0>::BasicTestExpr(&local_83b8,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginNumberOf
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),
             (NumericExpr)in_stack_ffffffffffff3e14.flags_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_8710 = local_8708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1754c2);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1754cf);
  std::__cxx11::string::~string(local_8770);
  std::allocator<char>::~allocator(&local_8771);
  local_8778 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndNumberOf(local_8710);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_8ac8 = local_8ac0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1755f5);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175602);
  std::__cxx11::string::~string(local_8b28);
  std::allocator<char>::~allocator(&local_8b29);
  BasicTestExpr<0>::BasicTestExpr(&local_8b30,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginSymbolicNumberOf
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_stack_ffffffffffff3e08,
             (int)((ulong)in_stack_ffffffffffff3e00 >> 0x20),(Expr)in_stack_ffffffffffff3e14.flags_)
  ;
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_8e88 = local_8e80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x17573d);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17574a);
  std::__cxx11::string::~string(local_8ee8);
  std::allocator<char>::~allocator(&local_8ee9);
  local_8ef0 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndSymbolicNumberOf
                                 (local_8e88);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_9240 = local_9238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175870);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17587d);
  std::__cxx11::string::~string(local_92a0);
  std::allocator<char>::~allocator(&local_92a1);
  local_92a8 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnBool
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,
                                  SUB81((ulong)in_stack_ffffffffffff3e00 >> 0x38,0));
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_95f8 = local_95f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1759a8);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1759b5);
  std::__cxx11::string::~string(local_9658);
  std::allocator<char>::~allocator(&local_9659);
  BasicTestExpr<0>::BasicTestExpr(&local_9660,NULL_ID);
  local_9664 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnNot
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,in_stack_ffffffffffff3e10);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_99b8 = local_99b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175b03);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175b10);
  std::__cxx11::string::~string(local_9a18);
  std::allocator<char>::~allocator(&local_9a19);
  BasicTestExpr<0>::BasicTestExpr(&local_9a20,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_9a24,NULL_ID);
  local_9a28 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnBinaryLogical
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  CONCAT44(in_stack_ffffffffffff3e14.flags_,
                                           in_stack_ffffffffffff3e10.id_),
                                  (Kind)((ulong)in_stack_ffffffffffff3e08 >> 0x20),
                                  in_stack_ffffffffffff3e20,in_stack_ffffffffffff3e1c);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_9d78 = local_9d70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (in_stack_ffffffffffff3f10,
             (char *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),iVar6,
             in_stack_ffffffffffff3ef8,in_stack_ffffffffffff3ef0);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175c7b);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175c88);
  std::__cxx11::string::~string(local_9dd8);
  std::allocator<char>::~allocator(&local_9dd9);
  this_02 = local_9d78;
  BasicTestExpr<0>::BasicTestExpr(&local_9de0,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_9de4,NULL_ID);
  LVar2 = mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnRelational
                    ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                     CONCAT44(in_stack_ffffffffffff3e14.flags_,in_stack_ffffffffffff3e10.id_),
                     (Kind)((ulong)in_stack_ffffffffffff3e08 >> 0x20),in_stack_ffffffffffff3e20.id_,
                     in_stack_ffffffffffff3e1c.id_);
  local_9de8 = LVar2.id_;
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  obj = local_a130;
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  iVar6 = (int)((ulong)&local_a199 >> 0x20);
  local_a138 = obj;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  call = MockNLHandler::gmock_OnUnhandled
                   (in_stack_ffffffffffff3e00,
                    (Matcher<const_char_*> *)
                    CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175df3);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175e00);
  std::__cxx11::string::~string(local_a198);
  std::allocator<char>::~allocator(&local_a199);
  BasicTestExpr<0>::BasicTestExpr(&local_a1a0,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_a1a4,NULL_ID);
  local_a1a8 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnLogicalCount
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  CONCAT44(in_stack_ffffffffffff3e14.flags_,
                                           in_stack_ffffffffffff3e10.id_),
                                  (Kind)((ulong)in_stack_ffffffffffff3e08 >> 0x20),
                                  in_stack_ffffffffffff3e20.id_,in_stack_ffffffffffff3e1c.id_);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_a4f8 = local_a4f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x175f6b);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175f78);
  std::__cxx11::string::~string(local_a558);
  std::allocator<char>::~allocator(&local_a559);
  BasicTestExpr<0>::BasicTestExpr(&local_a560,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_a564,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_a568,NULL_ID);
  local_a56c = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnImplication
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  CONCAT44(in_stack_ffffffffffff3e14.flags_,
                                           in_stack_ffffffffffff3e10.id_),in_stack_ffffffffffff3e20,
                                  in_stack_ffffffffffff3e1c,in_stack_ffffffffffff3e18);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_a8c0 = local_a8b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1760f6);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x176103);
  std::__cxx11::string::~string(local_a920);
  std::allocator<char>::~allocator(&local_a921);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginIteratedLogical
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_ac78 = local_ac70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x17621b);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x176228);
  std::__cxx11::string::~string(local_acd8);
  std::allocator<char>::~allocator(&local_acd9);
  local_ace0 = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndIteratedLogical
                                 (local_ac78);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_b030 = local_b028;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x176342);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17634f);
  std::__cxx11::string::~string(local_b090);
  std::allocator<char>::~allocator(&local_b091);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginPairwise
            (&in_stack_ffffffffffff3e00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,
             in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  local_b3e8 = local_b3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffff3e40,in_stack_ffffffffffff3e38,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(in_stack_ffffffffffff3e4c,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x176455);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x176462);
  std::__cxx11::string::~string(local_b448);
  std::allocator<char>::~allocator(&local_b449);
  LVar3 = mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndPairwise(local_b3e8);
  local_b450 = LVar3.id_;
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  __s = local_b798;
  MockNLHandler::MockNLHandler(in_stack_ffffffffffff3e40);
  pMVar4 = (MockNLHandler *)local_b801;
  local_b7a0 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar4,(char *)__s
             ,in_stack_ffffffffffff3e30);
  testing::StrEq((string *)CONCAT44(LVar3.id_,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(in_stack_ffffffffffff3e28);
  __a = MockNLHandler::gmock_OnUnhandled
                  (in_stack_ffffffffffff3e00,
                   (Matcher<const_char_*> *)
                   CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x176570);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x17657d);
  std::__cxx11::string::~string((string *)(local_b801 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b801);
  this_01 = local_b7a0;
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffff3e00,
             (char *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8));
  value.data_._4_4_ = in_stack_ffffffffffff3e14.flags_;
  value.data_._0_4_ = in_stack_ffffffffffff3e10.id_;
  value.size_._0_4_ = in_stack_ffffffffffff3e18.id_;
  value.size_._4_4_ = in_stack_ffffffffffff3e1c.id_;
  local_b81c = (IDType)mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnString
                                 ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)
                                  in_stack_ffffffffffff3e08,value);
  MockNLHandler::~MockNLHandler(in_stack_ffffffffffff3e00);
  local_bb70 = &local_bb68;
  MockNLHandler::MockNLHandler(pMVar4);
  paVar5 = &local_bbd1;
  this_00 = local_bb70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar4,(char *)__s
             ,(allocator<char> *)__a);
  testing::StrEq((string *)CONCAT44(LVar3.id_,in_stack_ffffffffffff3e48));
  testing::PolymorphicMatcher::operator_cast_to_Matcher(this_01);
  MockNLHandler::gmock_OnUnhandled
            (in_stack_ffffffffffff3e00,
             (Matcher<const_char_*> *)CONCAT44(in_stack_ffffffffffff3dfc,in_stack_ffffffffffff3df8))
  ;
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (this_02,(char *)CONCAT44(LVar2.id_,in_stack_ffffffffffff3f08),iVar6,obj,(char *)call);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x1766bb);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1766c8);
  std::__cxx11::string::~string(local_bbd0);
  std::allocator<char>::~allocator(&local_bbd1);
  pMVar4 = local_bb70;
  BasicTestExpr<0>::BasicTestExpr(&local_bbd8,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_bbdc,NULL_ID);
  BasicTestExpr<0>::BasicTestExpr(&local_bbe0,NULL_ID);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnSymbolicIf
            (&this_00->super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>,in_stack_ffffffffffff3e20,
             (Expr)(IDType)((ulong)paVar5 >> 0x20),(Expr)(IDType)paVar5);
  MockNLHandler::~MockNLHandler(pMVar4);
  return;
}

Assistant:

TEST(NLReaderTest, OnUnhandledDispatch) {
  EXPECT_UNHANDLED("NL header", OnHeader(mp::NLHeader()));
  EXPECT_UNHANDLED("objective", OnObj(0, mp::obj::MAX, TestExpr()));
  EXPECT_UNHANDLED("nonlinear constraint", OnAlgebraicCon(0, TestExpr()));
  EXPECT_UNHANDLED("logical constraint", OnLogicalCon(0, TestExpr()));
  EXPECT_UNHANDLED("common expression", BeginCommonExpr(0, 0));
  EXPECT_UNHANDLED("common expression", EndCommonExpr(0, TestExpr(), 0));
  EXPECT_UNHANDLED("complementarity constraint",
                   OnComplementarity(0, 0, mp::ComplInfo(0)));
  EXPECT_UNHANDLED("linear objective", OnLinearObjExpr(0, 0));
  EXPECT_UNHANDLED("linear constraint", OnLinearConExpr(0, 0));
  EXPECT_UNHANDLED("linear common expression", OnLinearCommonExpr(0, 0));
  EXPECT_UNHANDLED("variable bounds", OnVarBounds(0, 0, 0));
  EXPECT_UNHANDLED("constraint bounds", OnConBounds(0, 0, 0));
  EXPECT_UNHANDLED("initial value", OnInitialValue(0, 0));
  EXPECT_UNHANDLED("initial dual value", OnInitialDualValue(0, 0));
  EXPECT_UNHANDLED("column sizes", OnColumnSizes());
  EXPECT_UNHANDLED("function", OnFunction(0, "", 0, mp::func::NUMERIC));
  EXPECT_UNHANDLED("integer suffix", OnIntSuffix("",  mp::suf::OBJ, 0));
  EXPECT_UNHANDLED("double suffix", OnDblSuffix("",  mp::suf::OBJ, 0));
  EXPECT_UNHANDLED("number", OnNumber(0));
  EXPECT_UNHANDLED("variable reference", OnVariableRef(0));
  EXPECT_UNHANDLED("common expression reference", OnCommonExprRef(0));
  EXPECT_UNHANDLED("unary expression", OnUnary(expr::MINUS, TestExpr()));
  EXPECT_UNHANDLED("binary expression",
                   OnBinary(expr::ADD, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("if expression", OnIf(TestExpr(), TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("piecewise-linear term", BeginPLTerm(0));
  EXPECT_UNHANDLED("piecewise-linear term",
                   EndPLTerm(MockNLHandler::PLTermHandler(), TestExpr()));
  EXPECT_UNHANDLED("call expression", BeginCall(0, 0));
  EXPECT_UNHANDLED("call expression", EndCall(MockNLHandler::CallArgHandler()));
  EXPECT_UNHANDLED("vararg expression", BeginVarArg(mp::expr::MIN, 0));
  EXPECT_UNHANDLED("vararg expression",
                   EndVarArg(MockNLHandler::VarArgHandler()));
  EXPECT_UNHANDLED("summation", BeginSum(0));
  EXPECT_UNHANDLED("summation", EndSum(MockNLHandler::NumericArgHandler()));
  EXPECT_UNHANDLED("count expression", BeginCount(0));
  EXPECT_UNHANDLED("count expression",
                   EndCount(MockNLHandler::CountArgHandler()));
  EXPECT_UNHANDLED("numberof expression", BeginNumberOf(0, TestExpr()));
  EXPECT_UNHANDLED("numberof expression",
                   EndNumberOf(MockNLHandler::NumberOfArgHandler()));
  EXPECT_UNHANDLED("symbolic numberof expression",
                   BeginSymbolicNumberOf(0, TestExpr()));
  EXPECT_UNHANDLED("symbolic numberof expression",
                   EndSymbolicNumberOf(MockNLHandler::SymbolicArgHandler()));
  EXPECT_UNHANDLED("bool", OnBool(true));
  EXPECT_UNHANDLED("logical not", OnNot(TestExpr()));
  EXPECT_UNHANDLED("binary logical expression",
                   OnBinaryLogical(mp::expr::OR, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("relational expression",
                   OnRelational(mp::expr::LT, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("logical count expression",
                   OnLogicalCount(mp::expr::ATMOST, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("implication expression",
                   OnImplication(TestExpr(), TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("iterated logical expression",
                   BeginIteratedLogical(mp::expr::EXISTS, 0));
  EXPECT_UNHANDLED("iterated logical expression",
                   EndIteratedLogical(MockNLHandler::LogicalArgHandler()));
  EXPECT_UNHANDLED("pairwise expression",
                   BeginPairwise(mp::expr::ALLDIFF, 0));
  EXPECT_UNHANDLED("pairwise expression",
                   EndPairwise(MockNLHandler::PairwiseArgHandler()));
  EXPECT_UNHANDLED("string", OnString(""));
  EXPECT_UNHANDLED("symbolic if expression",
                   OnSymbolicIf(TestExpr(), TestExpr(), TestExpr()));
}